

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

hugeint_t duckdb::DecimalScaleUpCheckOperator::Operation<long,duckdb::hugeint_t>
                    (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  hugeint_t hVar2;
  undefined1 auVar3 [16];
  string error;
  hugeint_t result;
  string local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  hugeint_t local_88;
  string local_70;
  string local_50;
  
  if (input < *(long *)((long)dataptr + 0x20) && -*(long *)((long)dataptr + 0x20) < input) {
    bVar1 = TryCast::Operation<long,duckdb::hugeint_t>(input,&local_88,false);
    if (!bVar1) {
      auVar3 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,duckdb::hugeint_t>(&local_c8,(duckdb *)input,auVar3._8_8_);
      InvalidInputException::InvalidInputException(auVar3._0_8_,&local_c8);
      __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_c8._M_dataplus._M_p = (pointer)local_88.lower;
    local_c8._M_string_length = local_88.upper;
    hVar2 = hugeint_t::operator*((hugeint_t *)&local_c8,(hugeint_t *)((long)dataptr + 0x28));
  }
  else {
    local_a8[0] = local_98;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Casting value \"%s\" to type %s failed: value is out of range!",
               "");
    Decimal::ToString_abi_cxx11_
              (&local_50,(Decimal *)input,(ulong)*(byte *)((long)dataptr + 0x38),
               *(uint8_t *)((long)dataptr + 0x39),in_R8B);
    LogicalType::ToString_abi_cxx11_(&local_70,(LogicalType *)(*dataptr + 8));
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_c8,(StringUtil *)local_a8,&local_50,&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000081,in_R8B));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
    hVar2 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                      (&local_c8,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  return hVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}